

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# qmakeevaluator.cpp
# Opt level: O0

void __thiscall QMakeEvaluator::message(QMakeEvaluator *this,int type,QString *msg)

{
  undefined8 *puVar1;
  undefined8 in_RDX;
  undefined4 in_ESI;
  long in_RDI;
  undefined8 in_R9;
  long in_FS_OFFSET;
  ProFile *in_stack_ffffffffffffff98;
  uint local_5c;
  undefined1 local_20 [24];
  long local_8;
  
  local_8 = *(long *)(in_FS_OFFSET + 0x28);
  puVar1 = *(undefined8 **)(in_RDI + 0x2a0);
  if (*(short *)(in_RDI + 0x18) == 0) {
    QString::QString((QString *)0x2ff7d5);
  }
  else {
    ProFile::fileName(in_stack_ffffffffffffff98);
  }
  if (*(short *)(in_RDI + 0x18) == -1) {
    local_5c = 0xffffffff;
  }
  else {
    local_5c = (uint)*(ushort *)(in_RDI + 0x18);
  }
  (**(code **)*puVar1)(puVar1,in_ESI,in_RDX,local_20,local_5c,in_R9,local_20);
  QString::~QString((QString *)0x2ff82c);
  if (*(long *)(in_FS_OFFSET + 0x28) == local_8) {
    return;
  }
  __stack_chk_fail();
}

Assistant:

void QMakeEvaluator::message(int type, const QString &msg) const
{
    if (!m_skipLevel)
        m_handler->message(type | (m_cumulative ? QMakeHandler::CumulativeEvalMessage : 0), msg,
                m_current.line ? m_current.pro->fileName() : QString(),
                m_current.line != 0xffff ? m_current.line : -1);
}